

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SchemeReference.cpp
# Opt level: O1

cell * references::scheme::proc_less(cell *__return_storage_ptr__,cells *c)

{
  pointer pcVar1;
  pointer pcVar2;
  long lVar3;
  long lVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  
  pcVar1 = (c->
           super__Vector_base<references::scheme::cell,_std::allocator<references::scheme::cell>_>).
           _M_impl.super__Vector_impl_data._M_start;
  lVar3 = atol((pcVar1->val)._M_dataplus._M_p);
  pcVar2 = (c->
           super__Vector_base<references::scheme::cell,_std::allocator<references::scheme::cell>_>).
           _M_impl.super__Vector_impl_data._M_finish;
  do {
    if (pcVar1 + 1 == pcVar2) {
      __return_storage_ptr__->type = true_sym;
      (__return_storage_ptr__->val)._M_dataplus._M_p =
           (pointer)&(__return_storage_ptr__->val).field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&__return_storage_ptr__->val,DAT_00131258,DAT_00131260 + DAT_00131258);
      std::vector<references::scheme::cell,_std::allocator<references::scheme::cell>_>::vector
                (&__return_storage_ptr__->list,
                 (vector<references::scheme::cell,_std::allocator<references::scheme::cell>_> *)
                 &DAT_00131278);
      uVar5 = _DAT_00131290;
      uVar6 = uRam0000000000131294;
      uVar7 = _DAT_00131298;
      uVar8 = uRam000000000013129c;
      goto LAB_00114262;
    }
    lVar4 = atol(pcVar1[1].val._M_dataplus._M_p);
    pcVar1 = pcVar1 + 1;
  } while (lVar3 < lVar4);
  __return_storage_ptr__->type = false_sym;
  (__return_storage_ptr__->val)._M_dataplus._M_p = (pointer)&(__return_storage_ptr__->val).field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&__return_storage_ptr__->val,DAT_00131208,DAT_00131210 + DAT_00131208);
  std::vector<references::scheme::cell,_std::allocator<references::scheme::cell>_>::vector
            (&__return_storage_ptr__->list,
             (vector<references::scheme::cell,_std::allocator<references::scheme::cell>_> *)
             &DAT_00131228);
  uVar5 = _DAT_00131240;
  uVar6 = uRam0000000000131244;
  uVar7 = _DAT_00131248;
  uVar8 = uRam000000000013124c;
LAB_00114262:
  *(undefined4 *)&__return_storage_ptr__->proc = uVar5;
  *(undefined4 *)((long)&__return_storage_ptr__->proc + 4) = uVar6;
  *(undefined4 *)&__return_storage_ptr__->env = uVar7;
  *(undefined4 *)((long)&__return_storage_ptr__->env + 4) = uVar8;
  return __return_storage_ptr__;
}

Assistant:

cell proc_less(const cells & c)
{
	long n(atol(c[0].val.c_str()));
	for (cellit i = c.begin() + 1; i != c.end(); ++i)
		if (n >= atol(i->val.c_str()))
			return false_sym;
	return true_sym;
}